

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O1

void xmrig::Workers<xmrig::OclLaunchData>::onReady(void *arg)

{
  int iVar1;
  IWorker *pIVar2;
  char *pcVar3;
  undefined4 extraout_var;
  
  pIVar2 = create((Thread<xmrig::OclLaunchData> *)arg);
  iVar1 = (*pIVar2->_vptr_IWorker[2])(pIVar2);
  if ((char)iVar1 != '\0') {
    *(IWorker **)((long)arg + 0xf0) = pIVar2;
    (**(code **)(**(long **)((long)arg + 0xe8) + 0x50))(*(long **)((long)arg + 0xe8),pIVar2,1);
    return;
  }
  pcVar3 = OclLaunchData::tag();
  iVar1 = (*pIVar2->_vptr_IWorker[4])(pIVar2);
  Log::print(ERR,
             "%s \x1b[0;31mthread \x1b[0m\x1b[1;31m#%zu\x1b[0m\x1b[0;31m self-test failed\x1b[0m",
             pcVar3,CONCAT44(extraout_var,iVar1));
  (**(code **)(**(long **)((long)arg + 0xe8) + 0x50))(*(long **)((long)arg + 0xe8),pIVar2,0);
  (*pIVar2->_vptr_IWorker[1])(pIVar2);
  return;
}

Assistant:

void xmrig::Workers<T>::onReady(void *arg)
{
    auto handle = static_cast<Thread<T>* >(arg);

    IWorker *worker = create(handle);
    assert(worker != nullptr);

    if (!worker || !worker->selfTest()) {
        LOG_ERR("%s " RED("thread ") RED_BOLD("#%zu") RED(" self-test failed"), T::tag(), worker->id());

        handle->backend()->start(worker, false);
        delete worker;

        return;
    }

    assert(handle->backend() != nullptr);

    handle->setWorker(worker);
    handle->backend()->start(worker, true);
}